

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath __thiscall testing::internal::FilePath::RemoveExtension(FilePath *this,char *extension)

{
  void *__src;
  long lVar1;
  bool bVar2;
  char *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar3;
  FilePath FVar4;
  String dot_extension;
  String local_50;
  char *local_40 [2];
  
  String::Format((char *)local_40,".%s");
  bVar2 = String::EndsWithCaseInsensitive((String *)extension,local_40[0]);
  if (bVar2) {
    __src = *(void **)extension;
    lVar1 = *(long *)(extension + 8);
    __dest = (char *)operator_new__(lVar1 - 3);
    memcpy(__dest,__src,lVar1 - 4U);
    __dest[lVar1 + -4] = '\0';
    local_50.c_str_ = __dest;
    local_50.length_ = lVar1 - 4U;
    FilePath(this,&local_50);
    sVar3 = extraout_RDX;
    if (local_50.c_str_ != (char *)0x0) {
      operator_delete__(local_50.c_str_);
      sVar3 = extraout_RDX_00;
    }
  }
  else {
    (this->pathname_).c_str_ = (char *)0x0;
    (this->pathname_).length_ = 0;
    String::operator=(&this->pathname_,(String *)extension);
    sVar3 = extraout_RDX_01;
  }
  if (local_40[0] != (char *)0x0) {
    operator_delete__(local_40[0]);
    sVar3 = extraout_RDX_02;
  }
  FVar4.pathname_.length_ = sVar3;
  FVar4.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar4.pathname_;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  String dot_extension(String::Format(".%s", extension));
  if (pathname_.EndsWithCaseInsensitive(dot_extension.c_str())) {
    return FilePath(String(pathname_.c_str(), pathname_.length() - 4));
  }
  return *this;
}